

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

uint * fetchTransformedBilinear<(TextureBlendType)5,(QPixelLayout::BPP)4>
                 (uint *buffer,Operator *param_2,QSpanData *data,int y,int x,int length)

{
  anon_union_80_2_ea1780ee_for_QSpanData_24 *image;
  double dVar1;
  double dVar2;
  Format FVar3;
  long lVar4;
  QList<unsigned_int> *pQVar5;
  uchar *puVar6;
  long lVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  uint *puVar19;
  uint *puVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  uint *puVar24;
  int i;
  uint *buf1_00;
  long in_FS_OFFSET;
  uint fx;
  double dVar25;
  double dVar26;
  uint uVar27;
  double __x;
  uint uVar28;
  int iVar29;
  double dVar30;
  double __x_00;
  uint *local_50e8;
  uint uStack_50e4;
  double dStack_50e0;
  int disty;
  undefined1 auStack_5040 [8];
  ushort distys [1024];
  ushort distxs [1024];
  uint buf2 [2048];
  uint buf1 [2048];
  
  uVar21 = (ulong)(uint)length;
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  FVar3 = (data->field_23).texture.format;
  pQVar5 = (data->field_23).texture.colorTable;
  dVar25 = (double)x + 0.5;
  dVar26 = (double)y + 0.5;
  bVar8 = canUseFastMatrixPath(dVar25,dVar26,(long)length,data);
  dVar1 = data->m11;
  if (bVar8) {
    uVar28 = (uint)(dVar1 * 65536.0);
    iVar29 = (int)(data->m12 * 65536.0);
    image = &data->field_23;
    distxs._0_4_ = (int)((data->dx + data->m21 * dVar26 + dVar25 * dVar1) * 65536.0) - 0x8000;
    uVar27 = (int)((data->dy + data->m22 * dVar26 + dVar25 * data->m12) * 65536.0) - 0x8000;
    puVar24 = buffer;
    distys._0_4_ = uVar27;
    fx = distxs._0_4_;
    uStack_50e4 = uVar27;
    if (iVar29 == 0) {
      uVar17 = -uVar28;
      if (0 < (int)uVar28) {
        uVar17 = uVar28;
      }
      if (0x10000 < uVar17) {
        if (0x20000 < uVar17) {
          disty = uVar27 >> 8 & 0xff;
          local_50e8 = buffer;
          while (iVar29 = (int)uVar21, iVar29 != 0) {
            uVar18 = 0x400;
            if (iVar29 < 0x400) {
              uVar18 = uVar21;
            }
            buf1_00 = buf1;
            iVar13 = (int)uVar18;
            fetchTransformedBilinear_fetcher<(TextureBlendType)5,(QPixelLayout::BPP)4,unsigned_int>
                      (buf1_00,buf2,iVar13,&image->texture,distxs._0_4_,uVar27,uVar28,0);
            (*qPixelLayouts[FVar3].convertToARGB32PM)(buf1_00,iVar13 * 2,pQVar5);
            (*qPixelLayouts[FVar3].convertToARGB32PM)(buf2,iVar13 * 2,pQVar5);
            uVar21 = 0;
            if (0 < iVar13) {
              uVar21 = uVar18;
            }
            puVar24 = buf2;
            uVar17 = distxs._0_4_;
            for (uVar18 = 0; uVar21 != uVar18; uVar18 = uVar18 + 1) {
              uVar9 = interpolate_4_pixels(buf1_00,puVar24,uVar17 >> 8 & 0xff,disty);
              local_50e8[uVar18] = uVar9;
              uVar17 = uVar17 + uVar28;
              puVar24 = puVar24 + 2;
              buf1_00 = buf1_00 + 2;
            }
            local_50e8 = local_50e8 + iVar13;
            distxs._0_4_ = uVar17;
            uVar21 = (ulong)(uint)(iVar29 - iVar13);
          }
          goto LAB_005b03f0;
        }
        uVar27 = length + 1U >> 1;
        if (length < 0x400) {
          uVar27 = length;
        }
        fetchTransformedBilinear_simple_scale_helper<(TextureBlendType)5>
                  (buffer,buffer + (int)uVar27,&image->texture,(int *)distxs,(int *)distys,uVar28,
                   uVar28);
        puVar24 = buffer + (int)uVar27;
        fx = uVar28;
        if (uVar27 == length) goto LAB_005b03f0;
      }
      fetchTransformedBilinear_simple_scale_helper<(TextureBlendType)5>
                (puVar24,buffer + length,&image->texture,(int *)distxs,(int *)distys,uVar28,fx);
    }
    else {
      while (iVar13 = (int)uVar21, iVar13 != 0) {
        uVar18 = 0x400;
        if (iVar13 < 0x400) {
          uVar18 = uVar21;
        }
        iVar10 = (int)uVar18;
        fetchTransformedBilinear_fetcher<(TextureBlendType)5,(QPixelLayout::BPP)4,unsigned_int>
                  (buf1,buf2,iVar10,&image->texture,fx,uStack_50e4,uVar28,iVar29);
        (*qPixelLayouts[FVar3].convertToARGB32PM)(buf1,iVar10 * 2,pQVar5);
        (*qPixelLayouts[FVar3].convertToARGB32PM)(buf2,iVar10 * 2,pQVar5);
        uVar21 = 0;
        if (0 < iVar10) {
          uVar21 = uVar18;
        }
        puVar19 = buf1;
        puVar20 = buf2;
        for (uVar18 = 0; uVar21 != uVar18; uVar18 = uVar18 + 1) {
          uVar9 = interpolate_4_pixels(puVar19,puVar20,fx >> 8 & 0xff,uStack_50e4 >> 8 & 0xff);
          puVar24[uVar18] = uVar9;
          fx = fx + uVar28;
          uStack_50e4 = uStack_50e4 + iVar29;
          puVar20 = puVar20 + 2;
          puVar19 = puVar19 + 2;
        }
        puVar24 = puVar24 + iVar10;
        uVar21 = (ulong)(uint)(iVar13 - iVar10);
      }
    }
  }
  else {
    dVar2 = data->m13;
    auStack_5040 = (undefined1  [8])data->m12;
    dVar30 = dVar26 * data->m23 + dVar25 * dVar2 + data->m33;
    local_50e8 = (uint *)(data->dx + dVar26 * data->m21 + dVar25 * dVar1);
    dStack_50e0 = data->dy + dVar26 * data->m22 + dVar25 * (double)auStack_5040;
    puVar24 = buffer;
    while (iVar29 = (int)uVar21, iVar29 != 0) {
      uVar18 = 0x400;
      if (iVar29 < 0x400) {
        uVar18 = uVar21;
      }
      puVar6 = (data->field_23).texture.imageData;
      lVar7 = (data->field_23).texture.bytesPerLine;
      iVar13 = (int)uVar18;
      uVar21 = 0;
      if (0 < iVar13) {
        uVar21 = uVar18;
      }
      lVar22 = 1;
      uVar18 = uVar21;
      while (bVar8 = uVar18 != 0, uVar18 = uVar18 - 1, bVar8) {
        dVar25 = (double)(-(ulong)(dVar30 == 0.0) & 0x40d0000000000000 |
                         ~-(ulong)(dVar30 == 0.0) & (ulong)(1.0 / dVar30));
        __x_00 = (double)local_50e8 * dVar25 + -0.5;
        __x = dStack_50e0 * dVar25 + -0.5;
        dVar25 = floor(__x_00);
        dVar26 = floor(__x);
        *(short *)((long)distys + lVar22 + 0x7ff) =
             (short)(int)((__x_00 - (double)(int)dVar25) * 65536.0);
        *(short *)((long)distys + lVar22 + -1) = (short)(int)((__x - (double)(int)dVar26) * 65536.0)
        ;
        uVar27 = (data->field_23).texture.width;
        uVar28 = (data->field_23).texture.height;
        iVar10 = (int)dVar25 % (int)uVar27;
        uVar17 = iVar10 >> 0x1f & uVar27;
        uVar23 = uVar17 + iVar10 + 1;
        if (uVar23 == uVar27) {
          uVar23 = 0;
        }
        iVar15 = (int)dVar26 % (int)uVar28;
        uVar11 = iVar15 >> 0x1f & uVar28;
        uVar27 = uVar11 + iVar15 + 1;
        if (uVar27 == uVar28) {
          uVar27 = 0;
        }
        lVar12 = (int)(uVar11 + iVar15) * lVar7;
        lVar14 = (int)uVar27 * lVar7;
        lVar16 = (long)(int)(uVar17 + iVar10);
        buf2[lVar22 + 0x7ff] = (uint)*(ushort *)(puVar6 + lVar16 * 2 + lVar12);
        buf1[lVar22] = (uint)*(ushort *)(puVar6 + (long)(int)uVar23 * 2 + lVar12);
        buf2[lVar22 + -1] = (uint)*(ushort *)(puVar6 + lVar16 * 2 + lVar14);
        buf2[lVar22] = (uint)*(ushort *)(puVar6 + (long)(int)uVar23 * 2 + lVar14);
        local_50e8 = (uint *)((double)local_50e8 + dVar1);
        dStack_50e0 = dStack_50e0 + (double)auStack_5040;
        dVar30 = dVar30 + dVar2;
        lVar22 = lVar22 + 2;
      }
      puVar19 = buf1;
      (*qPixelLayouts[FVar3].convertToARGB32PM)(puVar19,iVar13 * 2,pQVar5);
      puVar20 = buf2;
      (*qPixelLayouts[FVar3].convertToARGB32PM)(puVar20,iVar13 * 2,pQVar5);
      for (uVar18 = 0; uVar21 != uVar18; uVar18 = uVar18 + 1) {
        uVar9 = interpolate_4_pixels
                          (puVar19,puVar20,(uint)*(byte *)((long)distxs + uVar18 * 2 + 1),
                           (uint)*(byte *)((long)distys + uVar18 * 2 + 1));
        puVar24[uVar18] = uVar9;
        puVar20 = puVar20 + 2;
        puVar19 = puVar19 + 2;
      }
      puVar24 = puVar24 + iVar13;
      uVar21 = (ulong)(uint)(iVar29 - iVar13);
    }
  }
LAB_005b03f0:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return buffer;
}

Assistant:

static const uint *QT_FASTCALL fetchTransformedBilinear(uint *buffer, const Operator *,
                                                        const QSpanData *data, int y, int x, int length)
{
    const QPixelLayout *layout = &qPixelLayouts[data->texture.format];
    const QList<QRgb> *clut = data->texture.colorTable;
    Q_ASSERT(bpp == QPixelLayout::BPPNone || layout->bpp == bpp);

    const qreal cx = x + qreal(0.5);
    const qreal cy = y + qreal(0.5);

    if (canUseFastMatrixPath(cx, cy, length, data)) {
        // The increment pr x in the scanline
        int fdx = (int)(data->m11 * fixed_scale);
        int fdy = (int)(data->m12 * fixed_scale);

        int fx = int((data->m21 * cy + data->m11 * cx + data->dx) * fixed_scale);
        int fy = int((data->m22 * cy + data->m12 * cx + data->dy) * fixed_scale);

        fx -= half_point;
        fy -= half_point;

        if (fdy == 0) { // simple scale, no rotation or shear
            if (qAbs(fdx) <= fixed_scale) { // scale up on X
                fetchTransformedBilinear_simple_scale_helper<blendType>(buffer, buffer + length, data->texture, fx, fy, fdx, fdy);
            } else if (qAbs(fdx) <= 2 * fixed_scale) { // scale down on X less than 2x
                const int mid = (length * 2 < BufferSize) ? length : ((length + 1) / 2);
                fetchTransformedBilinear_simple_scale_helper<blendType>(buffer, buffer + mid, data->texture, fx, fy, fdx, fdy);
                if (mid != length)
                    fetchTransformedBilinear_simple_scale_helper<blendType>(buffer + mid, buffer + length, data->texture, fx, fy, fdx, fdy);
            } else {
                const auto fetcher = fetchTransformedBilinear_fetcher<blendType,bpp,uint>;

                Q_DECL_UNINITIALIZED uint buf1[BufferSize];
                Q_DECL_UNINITIALIZED uint buf2[BufferSize];
                uint *b = buffer;
                while (length) {
                    int len = qMin(length, BufferSize / 2);
                    fetcher(buf1, buf2, len, data->texture, fx, fy, fdx, 0);
                    layout->convertToARGB32PM(buf1, len * 2, clut);
                    layout->convertToARGB32PM(buf2, len * 2, clut);

                    if (hasFastInterpolate4() || qAbs(data->m22) < qreal(1./8.)) { // scale up more than 8x (on Y)
                        int disty = (fy & 0x0000ffff) >> 8;
                        for (int i = 0; i < len; ++i) {
                            int distx = (fx & 0x0000ffff) >> 8;
                            b[i] = interpolate_4_pixels(buf1 + i * 2, buf2 + i * 2, distx, disty);
                            fx += fdx;
                        }
                    } else {
                        int disty = ((fy & 0x0000ffff) + 0x0800) >> 12;
                        for (int i = 0; i < len; ++i) {
                            uint tl = buf1[i * 2 + 0];
                            uint tr = buf1[i * 2 + 1];
                            uint bl = buf2[i * 2 + 0];
                            uint br = buf2[i * 2 + 1];
                            int distx = ((fx & 0x0000ffff) + 0x0800) >> 12;
                            b[i] = interpolate_4_pixels_16(tl, tr, bl, br, distx, disty);
                            fx += fdx;
                        }
                    }
                    length -= len;
                    b += len;
                }
            }
        } else { // rotation or shear
            const auto fetcher = fetchTransformedBilinear_fetcher<blendType,bpp,uint>;

            Q_DECL_UNINITIALIZED uint buf1[BufferSize];
            Q_DECL_UNINITIALIZED uint buf2[BufferSize];
            uint *b = buffer;
            while (length) {
                int len = qMin(length, BufferSize / 2);
                fetcher(buf1, buf2, len, data->texture, fx, fy, fdx, fdy);
                layout->convertToARGB32PM(buf1, len * 2, clut);
                layout->convertToARGB32PM(buf2, len * 2, clut);

                if (hasFastInterpolate4() || qAbs(data->m11) < qreal(1./8.) || qAbs(data->m22) < qreal(1./8.)) {
                    // If we are zooming more than 8 times, we use 8bit precision for the position.
                    for (int i = 0; i < len; ++i) {
                        int distx = (fx & 0x0000ffff) >> 8;
                        int disty = (fy & 0x0000ffff) >> 8;

                        b[i] = interpolate_4_pixels(buf1 + i * 2, buf2 + i * 2, distx, disty);
                        fx += fdx;
                        fy += fdy;
                    }
                } else {
                    // We are zooming less than 8x, use 4bit precision
                    for (int i = 0; i < len; ++i) {
                        uint tl = buf1[i * 2 + 0];
                        uint tr = buf1[i * 2 + 1];
                        uint bl = buf2[i * 2 + 0];
                        uint br = buf2[i * 2 + 1];

                        int distx = ((fx & 0x0000ffff) + 0x0800) >> 12;
                        int disty = ((fy & 0x0000ffff) + 0x0800) >> 12;

                        b[i] = interpolate_4_pixels_16(tl, tr, bl, br, distx, disty);
                        fx += fdx;
                        fy += fdy;
                    }
                }

                length -= len;
                b += len;
            }
        }
    } else {
        const auto fetcher = fetchTransformedBilinear_slow_fetcher<blendType,bpp,uint>;

        const qreal fdx = data->m11;
        const qreal fdy = data->m12;
        const qreal fdw = data->m13;

        qreal fx = data->m21 * cy + data->m11 * cx + data->dx;
        qreal fy = data->m22 * cy + data->m12 * cx + data->dy;
        qreal fw = data->m23 * cy + data->m13 * cx + data->m33;

        Q_DECL_UNINITIALIZED uint buf1[BufferSize];
        Q_DECL_UNINITIALIZED uint buf2[BufferSize];
        uint *b = buffer;

        Q_DECL_UNINITIALIZED ushort distxs[BufferSize / 2];
        Q_DECL_UNINITIALIZED ushort distys[BufferSize / 2];

        while (length) {
            const int len = qMin(length, BufferSize / 2);
            fetcher(buf1, buf2, distxs, distys, len, data->texture, fx, fy, fw, fdx, fdy, fdw);

            layout->convertToARGB32PM(buf1, len * 2, clut);
            layout->convertToARGB32PM(buf2, len * 2, clut);

            for (int i = 0; i < len; ++i) {
                const int distx = distxs[i] >> 8;
                const int disty = distys[i] >> 8;

                b[i] = interpolate_4_pixels(buf1 + i * 2, buf2 + i * 2, distx, disty);
            }
            length -= len;
            b += len;
        }
    }

    return buffer;
}